

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

void __thiscall NaVector::min_max(NaVector *this,NaReal *vMin,NaReal *vMax)

{
  NaReal NVar1;
  NaReal *pNVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  
  iVar3 = (*this->_vptr_NaVector[6])();
  if (iVar3 != 0) {
    uVar5 = 0;
    do {
      pNVar2 = this->pVect;
      if (uVar5 == 0) {
        NVar1 = *pNVar2;
        *vMax = NVar1;
        *vMin = NVar1;
      }
      else {
        dVar6 = pNVar2[uVar5];
        if (dVar6 < *vMin) {
          *vMin = dVar6;
          dVar6 = pNVar2[uVar5];
        }
        if (*vMax <= dVar6 && dVar6 != *vMax) {
          *vMax = dVar6;
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = (*this->_vptr_NaVector[6])(this);
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void
NaVector::min_max (NaReal& vMin, NaReal& vMax) const
{
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        if(0 == i)
            vMin = vMax = pVect[i];
        else{
            if(pVect[i] < vMin)
                vMin = pVect[i];
            if(pVect[i] > vMax)
                vMax = pVect[i];
        }
    }
}